

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.cpp
# Opt level: O0

void InsertSort(int *A,int n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_20;
  int i;
  int temp;
  int j;
  int n_local;
  int *A_local;
  
  for (local_20 = 1; local_20 < n; local_20 = local_20 + 1) {
    iVar1 = A[local_20];
    iVar3 = local_20;
    while( true ) {
      i = iVar3 + -1;
      bVar2 = false;
      if (-1 < i) {
        bVar2 = iVar1 < A[i];
      }
      if (!bVar2) break;
      A[iVar3] = A[i];
      iVar3 = i;
    }
    A[iVar3] = iVar1;
  }
  return;
}

Assistant:

void InsertSort(int A[], int n) {
    int j,temp;
    for(int i = 1; i < n; ++i) {
        temp = A[i];  //将待插入关键字暂存于temp中
        j = i-1;
        //下面这个while循环完成了从待排序关键字之前的关键字扫描，如果大于待排关键字则后移一位
        while(j>=0 && temp<A[j]) {
            A[j+1] = A[j];
            --j;
        }
        A[j+1] = temp;   //找到插入位置就插入
    }
}